

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmaster.c
# Opt level: O1

ebml_element * Copy(ebml_element *Element)

{
  ebml_element *peVar1;
  
  peVar1 = EBML_ElementCreate(Element,Element->Context,0,-1);
  if (peVar1 != (ebml_element *)0x0) {
    peVar1->bValueIsSet = Element->bValueIsSet;
    peVar1->DataSize = Element->DataSize;
    peVar1->ElementPosition = Element->ElementPosition;
    peVar1->SizeLength = Element->SizeLength;
    peVar1->SizePosition = Element->SizePosition;
    peVar1->EndPosition = Element->EndPosition;
    peVar1->bNeedDataSizeUpdate = Element->bNeedDataSizeUpdate;
  }
  return peVar1;
}

Assistant:

static ebml_element *Copy(const ebml_master *Element)
{
    ebml_element *i, *Elt;
    ebml_master *Result = (ebml_master*)EBML_ElementCreate(Element,Element->Base.Context,0,EBML_ANY_PROFILE);
    if (Result)
    {
        EBML_MasterErase(Result); // delete the children elements created by default
        Result->Base.bValueIsSet = Element->Base.bValueIsSet;
        Result->Base.DataSize = Element->Base.DataSize;
        Result->Base.ElementPosition = Element->Base.ElementPosition;
        Result->Base.SizeLength = Element->Base.SizeLength;
        Result->Base.SizePosition = Element->Base.SizePosition;
        Result->Base.EndPosition = Element->Base.EndPosition;
        Result->Base.bNeedDataSizeUpdate = Element->Base.bNeedDataSizeUpdate;
        Result->CheckSumStatus = Element->CheckSumStatus;
        for (i=EBML_MasterChildren(Element);i;i=EBML_MasterNext(i))
        {
            Elt = EBML_ElementCopy(i);
            if (!Elt || EBML_MasterAppend(Result, Elt)!=ERR_NONE)
            {
                NodeDelete((node*)Result);
                Result = NULL;
                break;
            }
        }
    }
    return (ebml_element*)Result;
}